

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall
SocketReceiveMultiplexer::Implementation::AttachPeriodicTimerListener
          (Implementation *this,int initialDelayMilliseconds,int periodMilliseconds,
          TimerListener *listener)

{
  AttachedTimerListener local_30;
  TimerListener *local_20;
  TimerListener *listener_local;
  int periodMilliseconds_local;
  int initialDelayMilliseconds_local;
  Implementation *this_local;
  
  local_20 = listener;
  listener_local._0_4_ = periodMilliseconds;
  listener_local._4_4_ = initialDelayMilliseconds;
  _periodMilliseconds_local = this;
  AttachedTimerListener::AttachedTimerListener
            (&local_30,initialDelayMilliseconds,periodMilliseconds,listener);
  std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::push_back
            (&this->timerListeners_,&local_30);
  return;
}

Assistant:

void AttachPeriodicTimerListener( int initialDelayMilliseconds, int periodMilliseconds, TimerListener *listener )
	{
		timerListeners_.push_back( AttachedTimerListener( initialDelayMilliseconds, periodMilliseconds, listener ) );
	}